

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Dumper::appendInt(Dumper *this,int64_t v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  int iVar20;
  
  if (v < 0) {
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x2d);
    v = -v;
  }
  if (999999999999999999 < v) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)v >> 0x12;
    uVar19 = (ulong)SUB161(auVar1 * ZEXT816(0x49c97747490f),0xb);
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar19 | 0x30,uVar19 | 0x30);
  }
  if (99999999999999999 < v) {
    iVar20 = (int)(((ulong)v / 100000000000000000) / 10);
    uVar19 = (ulong)(uint)((int)((ulong)v / 100000000000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (9999999999999999 < v) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)v / 10000000000000000;
    iVar20 = SUB164(auVar2 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 10000000000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (999999999999999 < v) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (ulong)v / 1000000000000000;
    iVar20 = SUB164(auVar3 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 1000000000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (99999999999999 < v) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (ulong)v / 100000000000000;
    iVar20 = SUB164(auVar4 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 100000000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (9999999999999 < v) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ulong)v / 10000000000000;
    iVar20 = SUB164(auVar5 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 10000000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (999999999999 < v) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)v / 1000000000000;
    iVar20 = SUB164(auVar6 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 1000000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (99999999999 < v) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)v / 100000000000;
    iVar20 = SUB164(auVar7 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 100000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (9999999999 < v) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (ulong)v / 10000000000;
    iVar20 = SUB164(auVar8 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 10000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (999999999 < v) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (ulong)v / 1000000000;
    iVar20 = SUB164(auVar9 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 1000000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (99999999 < v) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (ulong)v / 100000000;
    iVar20 = SUB164(auVar10 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 100000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (9999999 < v) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (ulong)v / 10000000;
    iVar20 = SUB164(auVar11 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 10000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (999999 < v) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (ulong)v / 1000000;
    iVar20 = SUB164(auVar12 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 1000000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (99999 < v) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (ulong)v / 100000;
    iVar20 = SUB164(auVar13 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 100000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (9999 < v) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (ulong)v / 10000;
    iVar20 = SUB164(auVar14 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 10000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (999 < v) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (ulong)v / 1000;
    iVar20 = SUB164(auVar15 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 1000) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (99 < v) {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (ulong)v / 100;
    iVar20 = SUB164(auVar16 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 100) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  if (9 < v) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (ulong)v / 10;
    iVar20 = SUB164(auVar17 * ZEXT816(0x199999999999999a),8);
    uVar19 = (ulong)(uint)((int)((ulong)v / 10) + iVar20 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar19 & 0xff | 0x30,(ulong)(uint)(iVar20 * 2),uVar19 | 0x30);
  }
  auVar18._8_8_ = 0;
  auVar18._0_8_ = v;
  (*this->_sink->_vptr_Sink[2])
            (this->_sink,
             (ulong)(byte)((char)v + ((byte)(SUB164(auVar18 * ZEXT816(0xcccccccccccccccd),8) >> 2) &
                                     0xfe) * -5 | 0x30));
  return;
}

Assistant:

void Dumper::appendInt(int64_t v) {
  if (v == INT64_MIN) {
    _sink->append("-9223372036854775808", 20);
    return;
  }
  if (v < 0) {
    _sink->push_back('-');
    v = -v;
  }

  if (1000000000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000000000LL) % 10);
  }
  if (100000000000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000000000LL) % 10);
  }
  if (10000000000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000000000LL) % 10);
  }
  if (1000000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000000LL) % 10);
  }
  if (100000000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000000LL) % 10);
  }
  if (10000000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000000LL) % 10);
  }
  if (1000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000LL) % 10);
  }
  if (100000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000LL) % 10);
  }
  if (10000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000LL) % 10);
  }
  if (1000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000LL) % 10);
  }
  if (100000000LL <= v) {
    _sink->push_back('0' + (v / 100000000LL) % 10);
  }
  if (10000000LL <= v) {
    _sink->push_back('0' + (v / 10000000LL) % 10);
  }
  if (1000000LL <= v) {
    _sink->push_back('0' + (v / 1000000LL) % 10);
  }
  if (100000LL <= v) {
    _sink->push_back('0' + (v / 100000LL) % 10);
  }
  if (10000LL <= v) {
    _sink->push_back('0' + (v / 10000LL) % 10);
  }
  if (1000LL <= v) {
    _sink->push_back('0' + (v / 1000LL) % 10);
  }
  if (100LL <= v) {
    _sink->push_back('0' + (v / 100LL) % 10);
  }
  if (10LL <= v) {
    _sink->push_back('0' + (v / 10LL) % 10);
  }

  _sink->push_back('0' + (v % 10));
}